

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O0

gboolean print_tree_entries(gpointer key,gpointer value,gpointer data)

{
  int local_24;
  int i;
  gpointer data_local;
  gpointer value_local;
  gpointer key_local;
  
  for (local_24 = 0; local_24 < (int)data; local_24 = local_24 + 1) {
    putchar(0x20);
  }
  print_utf8_string(*(char **)((long)key + 8));
  putchar(10);
  if (value != (gpointer)0x0) {
    g_tree_foreach(value,print_tree_entries,(long)((int)data + 2));
  }
  return 0;
}

Assistant:

static gboolean print_tree_entries(gpointer key,
                                   gpointer value,
                                   gpointer data)
{
    int i;
    for (i = 0; i < GPOINTER_TO_INT(data); ++i) {
        putchar(' ');
    }
    print_utf8_string(((struct filename_representations*) key)->display);
    putchar('\n');
    if (value) {
        g_tree_foreach((Filetree) value,
                       print_tree_entries,
                       GINT_TO_POINTER(GPOINTER_TO_INT(data) + 2));
    }
    return FALSE;
}